

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall ACSStringPool::AddString(ACSStringPool *this,FString *str)

{
  DWORD h;
  uint uVar1;
  int iVar2;
  
  h = SuperFastHash(str->Chars,(ulong)*(uint *)(str->Chars + -0xc));
  uVar1 = FindString(this,str->Chars,(ulong)*(uint *)(str->Chars + -0xc),h,h % 0xfb);
  if (-1 < (int)uVar1) {
    return uVar1 | 0x7ff00000;
  }
  iVar2 = InsertString(this,str,h,h % 0xfb);
  return iVar2;
}

Assistant:

int ACSStringPool::AddString(FString &str)
{
	unsigned int h = SuperFastHash(str.GetChars(), str.Len());
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, str.Len(), h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	return InsertString(str, h, bucketnum);
}